

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O0

void __thiscall
TPZPrInteg<TPZIntPrism3D>::GetOrder(TPZPrInteg<TPZIntPrism3D> *this,TPZVec<int> *ord)

{
  int iVar1;
  int64_t iVar2;
  int *piVar3;
  TPZIntPrism3D *in_RSI;
  TPZVec<int> *in_RDI;
  
  iVar2 = TPZVec<int>::NElements((TPZVec<int> *)in_RSI);
  if (iVar2 < 4) {
    std::operator<<((ostream *)&std::cout,
                    "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n"
                   );
  }
  else {
    TPZIntPrism3D::GetOrder(in_RSI,in_RDI);
    iVar1 = *(int *)&in_RDI[2]._vptr_TPZVec;
    piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)in_RSI,3);
    *piVar3 = iVar1;
  }
  return;
}

Assistant:

void GetOrder(TPZVec<int> &ord) const override
    {
#ifndef PZNODEBUG
		if(ord.NElements() < Dim) {
			std::cout << "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n";
			return;
		}
#endif
		TFather::GetOrder(ord);
		ord[Dim-1] = fOrdKsi;
    }